

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelNoClockAnalyzerSettings.cpp
# Opt level: O3

void __thiscall
SimpleParallelAnalyzerSettings::LoadSettings(SimpleParallelAnalyzerSettings *this,char *settings)

{
  ulong uVar1;
  long lVar2;
  Channel *this_00;
  ulong uVar3;
  SimpleArchive text_archive;
  char text [64];
  SimpleArchive local_a0 [8];
  Channel *local_98;
  ulong local_90;
  Channel local_88 [16];
  char local_78 [72];
  
  SimpleArchive::SimpleArchive(local_a0);
  SimpleArchive::SetString((char *)local_a0);
  uVar3 = (ulong)((long)(this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 4;
  if ((int)uVar3 != 0) {
    uVar1 = uVar3 & 0xffffffff;
    lVar2 = 0;
    do {
      SimpleArchive::operator>>
                (local_a0,(this->mDataChannels).
                          super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar2);
      lVar2 = lVar2 + 0x10;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  local_98 = &this->mClockChannel;
  SimpleArchive::operator>>(local_a0,local_98);
  SimpleArchive::operator>>(local_a0,&this->mClockEdge);
  AnalyzerSettings::ClearChannels();
  if ((int)uVar3 != 0) {
    local_90 = uVar3 & 0xffffffff;
    lVar2 = 0;
    uVar3 = 0;
    do {
      sprintf(local_78,"D%d",uVar3 & 0xffffffff);
      this_00 = (this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
                super__Vector_impl_data._M_start + lVar2;
      Channel::Channel(local_88,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
      Channel::operator!=(this_00,local_88);
      AnalyzerSettings::AddChannel((Channel *)this,(char *)this_00,SUB81(local_78,0));
      Channel::~Channel(local_88);
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x10;
    } while (local_90 != uVar3);
  }
  AnalyzerSettings::AddChannel((Channel *)this,(char *)local_98,true);
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(local_a0);
  return;
}

Assistant:

void SimpleParallelAnalyzerSettings::LoadSettings( const char* settings )
{
	SimpleArchive text_archive;
	text_archive.SetString( settings );

	U32 count = (U32)mDataChannels.size();

	for( U32 i=0; i<count; i++ )
	{
		text_archive >> mDataChannels[i];
	}

	text_archive >> mClockChannel;
	text_archive >> *(U32*)&mClockEdge;

	ClearChannels();
	for( U32 i=0; i<count; i++ )
	{
		char text[64];
		sprintf( text, "D%d", i );
		AddChannel( mDataChannels[i], text, mDataChannels[i] != UNDEFINED_CHANNEL );
	}

	AddChannel( mClockChannel, "Clock", true );

	UpdateInterfacesFromSettings();
}